

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void ntileValueFunc(sqlite3_context *pCtx)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  plVar2 = (long *)sqlite3_aggregate_context(pCtx,0x18);
  if ((plVar2 != (long *)0x0) && (lVar3 = plVar2[1], 0 < lVar3)) {
    iVar1 = (int)(*plVar2 / lVar3);
    if (iVar1 == 0) {
      lVar3 = plVar2[2];
    }
    else {
      lVar5 = *plVar2 - lVar3 * iVar1;
      lVar4 = lVar5 * (iVar1 + 1);
      lVar3 = plVar2[2];
      if (lVar3 < lVar4) {
        lVar3 = lVar3 / (long)(iVar1 + 1);
      }
      else {
        lVar3 = lVar5 + (lVar3 - lVar4) / (long)iVar1;
      }
    }
    sqlite3_result_int64(pCtx,lVar3 + 1);
    return;
  }
  return;
}

Assistant:

static void ntileValueFunc(sqlite3_context *pCtx){
  struct NtileCtx *p;
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->nParam>0 ){
    int nSize = (p->nTotal / p->nParam);
    if( nSize==0 ){
      sqlite3_result_int64(pCtx, p->iRow+1);
    }else{
      i64 nLarge = p->nTotal - p->nParam*nSize;
      i64 iSmall = nLarge*(nSize+1);
      i64 iRow = p->iRow;

      assert( (nLarge*(nSize+1) + (p->nParam-nLarge)*nSize)==p->nTotal );

      if( iRow<iSmall ){
        sqlite3_result_int64(pCtx, 1 + iRow/(nSize+1));
      }else{
        sqlite3_result_int64(pCtx, 1 + nLarge + (iRow-iSmall)/nSize);
      }
    }
  }
}